

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_details::push_down_tail<int,false,6>
          (rrb_details *this,ref<immutable::rrb<int,_false,_6>_> *in,
          ref<immutable::rrb<int,_false,_6>_> *new_rrb,
          ref<immutable::rrb_details::leaf_node<int,_false>_> *new_tail)

{
  long lVar1;
  byte bVar2;
  rrb<int,_false,_6> *prVar3;
  internal_node<int,_false> *piVar4;
  rrb_size_table<false> *prVar5;
  leaf_node<int,_false> *plVar6;
  ref<immutable::rrb_details::internal_node<int,_false>_> *to_set;
  ref<immutable::rrb_details::internal_node<int,false>> *prVar7;
  tree_node<int,_false> *ptVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint uVar13;
  int iVar14;
  uint local_74;
  ref<immutable::rrb_details::internal_node<int,_false>_> new_root;
  ref<immutable::rrb_details::internal_node<int,_false>_> current;
  ref<immutable::rrb_details::leaf_node<int,_false>_> old_tail;
  ref<immutable::rrb_details::rrb_size_table<false>_> table;
  
  prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
  old_tail.ptr = (prVar3->tail).ptr;
  if (old_tail.ptr != (leaf_node<int,_false> *)0x0) {
    (old_tail.ptr)->_ref_count = (old_tail.ptr)->_ref_count + 1;
  }
  prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar3->tail,new_tail);
  prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
  if ((prVar3->root).ptr == (tree_node<int,_false> *)0x0) {
    prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
    prVar3->shift = 0;
    prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
    ref<immutable::rrb_details::tree_node<int,false>>::operator=
              ((ref<immutable::rrb_details::tree_node<int,false>> *)&prVar3->root,&old_tail);
    prVar3 = new_rrb->ptr;
    *(rrb<int,_false,_6> **)this = prVar3;
    if (prVar3 != (rrb<int,_false,_6> *)0x0) {
      prVar3->_ref_count = prVar3->_ref_count + 1;
    }
  }
  else {
    prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
    uVar9 = prVar3->cnt;
    prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
    current.ptr = (internal_node<int,_false> *)(prVar3->root).ptr;
    if (current.ptr != (internal_node<int,_false> *)0x0) {
      (current.ptr)->_ref_count = (current.ptr)->_ref_count + 1;
    }
    local_74 = uVar9 - 1;
    prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
    uVar9 = prVar3->shift;
    iVar14 = uVar9 + 5;
    uVar11 = 0;
    uVar10 = 0;
    for (; uVar12 = uVar11, 6 < uVar9; uVar9 = uVar9 - 6) {
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&current);
      if ((piVar4->size_table).ptr == (rrb_size_table<false> *)0x0) {
        bVar2 = (byte)uVar9;
        if (local_74 >> (bVar2 + 6 & 0x1f) != 0) {
          uVar10 = uVar10 + 1;
          goto LAB_001444dd;
        }
        uVar13 = local_74 >> (bVar2 & 0x1f) & 0x3f;
        local_74 = local_74 & ~(0x3f << (bVar2 & 0x1f));
LAB_001443ed:
        if (uVar13 < 0x3f) {
          uVar11 = uVar10 + 1;
        }
      }
      else {
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&current);
        uVar12 = piVar4->len;
        uVar13 = uVar12 - 1;
        if (uVar13 != 0) {
          piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&current);
          prVar5 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                             (&piVar4->size_table);
          local_74 = local_74 - prVar5->size[uVar12 - 2];
          goto LAB_001443ed;
        }
        uVar13 = 0;
        uVar11 = uVar10 + 1;
      }
      uVar12 = uVar10 + 1;
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&current);
      if (uVar13 < piVar4->len) {
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&current);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (&current,piVar4->child + uVar13);
      }
      else {
        new_root.ptr = (internal_node<int,_false> *)0x0;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(&current,&new_root);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&new_root);
      }
      uVar10 = uVar12;
      if (current.ptr == (internal_node<int,_false> *)0x0) goto LAB_001444dd;
      iVar14 = iVar14 + -6;
    }
    if (uVar9 != 0) {
      uVar10 = uVar10 + 1;
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&current);
      if (piVar4->len < 0x40) {
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&current);
        uVar12 = uVar10;
      }
    }
LAB_001444dd:
    if (5 < uVar9) {
      uVar9 = 6;
    }
    uVar10 = (iVar14 - uVar9) / 6 + uVar10;
    if (uVar12 == 0) {
      new_root.ptr = internal_node_create<int,false>(2);
      if (new_root.ptr != (internal_node<int,_false> *)0x0) {
        (new_root.ptr)->_ref_count = 1;
      }
      prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&new_root);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)piVar4->child,
                 &prVar3->root);
      prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
      ref<immutable::rrb_details::tree_node<int,false>>::operator=
                ((ref<immutable::rrb_details::tree_node<int,false>> *)&prVar3->root,&new_root);
      prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
      uVar9 = prVar3->shift;
      prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
      prVar3->shift = uVar9 + 6;
      prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
      ptVar8 = ref<immutable::rrb_details::tree_node<int,_false>_>::operator->(&prVar3->root);
      if ((ptVar8->type != LEAF_NODE) &&
         (prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in), ptVar8 = (prVar3->root).ptr,
         lVar1._0_4_ = ptVar8[1].type, lVar1._4_4_ = ptVar8[1].len, lVar1 != 0)) {
        table.ptr = size_table_create<false>(2);
        if (table.ptr != (rrb_size_table<false> *)0x0) {
          (table.ptr)->_ref_count = 1;
        }
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
        uVar9 = prVar3->cnt;
        plVar6 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&old_tail);
        uVar11 = plVar6->len;
        prVar5 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&table);
        *prVar5->size = uVar9 - uVar11;
        prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
        uVar9 = prVar3->cnt;
        prVar5 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&table);
        prVar5->size[1] = uVar9;
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&new_root);
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=(&piVar4->size_table,&table);
        release(table.ptr);
      }
      prVar3 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
      prVar7 = (ref<immutable::rrb_details::internal_node<int,false>> *)
               append_empty<int,false>
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                          (*(long *)&(prVar3->root).ptr[1]._ref_count + 8),uVar10);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=(prVar7,&old_tail);
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&new_root);
    }
    else {
      plVar6 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&old_tail);
      to_set = copy_first_k<int,false,6>(in,new_rrb,uVar12,plVar6->len);
      prVar7 = (ref<immutable::rrb_details::internal_node<int,false>> *)
               append_empty<int,false>(to_set,uVar10 - uVar12);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=(prVar7,&old_tail);
    }
    prVar3 = new_rrb->ptr;
    *(rrb<int,_false,_6> **)this = prVar3;
    if (prVar3 != (rrb<int,_false,_6> *)0x0) {
      prVar3->_ref_count = prVar3->_ref_count + 1;
    }
    ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&current);
  }
  release<int>(old_tail.ptr);
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> push_down_tail(const ref<rrb<T, atomic_ref_counting, N>>& in, const ref<rrb<T, atomic_ref_counting, N>>& new_rrb, const ref<leaf_node<T, atomic_ref_counting>>& new_tail)
      {
      ref<leaf_node<T, atomic_ref_counting>> old_tail = new_rrb->tail;
      new_rrb->tail = new_tail;
      //if (in->cnt <= bits<N>::rrb_branching)
      if (in->root.ptr == nullptr) // [JanM] old code is commented out above. Fixed this due to bug, see unit test test_bug_concat in vector_tests.cpp
        {
        new_rrb->shift = 0;
        new_rrb->root = old_tail;
        return new_rrb;
        }

      // Copyable count starts here

      // TODO: Can find last rightmost jump in constant time for pvec subvecs:
      // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

      uint32_t index = in->cnt - 1;

      uint32_t nodes_to_copy = 0;
      uint32_t nodes_visited = 0;
      uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                        // copyable node (or the element, if we can copy the leaf)
      ref<internal_node<T, atomic_ref_counting>> current = in->root;
      uint32_t shift = in->shift;

      // checking all non-leaf nodes (or if tail, all but the lowest two levels)
      while (shift > bits<N>::rrb_bits)
        {
        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          // some check here to ensure we're not overflowing the pvec subvec.
          // important to realise that this only needs to be done once in a better
          // impl, the same way the size_table check only has to be done until it's
          // false.
          const uint32_t prev_shift = shift + bits<N>::rrb_bits;
          if (index >> prev_shift > 0)
            {
            nodes_visited++; // this could possibly be done earlier in the code.
            goto copyable_count_end;
            }
          child_index = (index >> shift) & bits<N>::rrb_mask;
          // index filtering is not necessary when the check above is performed at
          // most once.
          index &= ~(bits<N>::rrb_mask << shift);
          }
        else
          {
          // no need for sized_pos here, luckily.
          child_index = current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        nodes_visited++;
        if (child_index < bits<N>::rrb_mask)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;
          }

        if (child_index < current->len)
          current = current->child[child_index];
        else
          current = ref<internal_node<T, atomic_ref_counting>>();
        // This will only happen in a pvec subtree
        if (current.ptr == nullptr)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;

          // if next element we're looking at is null, we can copy all above. Good
          // times.
          goto copyable_count_end;
          }
        shift -= bits<N>::rrb_bits;
        }
      // if we're here, we're at the leaf node (or lowest non-leaf), which is
      // `current`

      // no need to even use index here: We know it'll be placed at current->len,
      // if there's enough space. That check is easy.
      if (shift != 0)
        {
        nodes_visited++;
        if (current->len < bits<N>::rrb_branching)
          {
          nodes_to_copy = nodes_visited;
          pos = current->len;
          }
        }

    copyable_count_end:
      // GURRHH, nodes_visited is not yet handled nicely. for loop down to get
      // nodes_visited set straight.
      while (shift > bits<N>::rrb_bits)
        {
        nodes_visited++;
        shift -= bits<N>::rrb_bits;
        }

      // Increasing height of tree.
      if (nodes_to_copy == 0)
        {
        ref<internal_node<T, atomic_ref_counting>> new_root = internal_node_create<T, atomic_ref_counting>(2);
        new_root->child[0] = in->root;
        new_rrb->root = new_root;
        new_rrb->shift = new_rrb->shift + bits<N>::rrb_bits;

        // create size table if the original rrb root has a size table.
        if (in->root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)in->root.ptr)->size_table.ptr != nullptr)
          {
          ref<rrb_size_table<atomic_ref_counting>> table = size_table_create<atomic_ref_counting>(2);
          table->size[0] = in->cnt - old_tail->len;
          // If we insert the tail, the old size minus the old tail size will be the
          // amount of elements in the left branch. If there is no tail, the size is
          // just the old rrb-tree.

          table->size[1] = in->cnt;
          // If we insert the tail, the old size would include the tail.
          // Consequently, it has to be the old size. If we have no tail, we append
          // a single element to the old vector, therefore it has to be one more
          // than the original.

          new_root->size_table = table;
          }

        // nodes visited == original rrb tree height. Nodes visited > 0.
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(&((internal_node<T, atomic_ref_counting> *)new_rrb->root.ptr)->child[1], nodes_visited);
        *to_set = old_tail;
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>>* node = copy_first_k(in, new_rrb, nodes_to_copy, old_tail->len);
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(node, nodes_visited - nodes_to_copy);
        *to_set = old_tail;
        }
      return new_rrb;
      }